

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start,bool type)

{
  Breakpoint *pBVar1;
  Breakpoint *pBVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  BreakpointSource BVar6;
  int iVar7;
  BreakpointSource BVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  Breakpoint *pBVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  Breakpoint tmp;
  
  if (start + 1 < end) {
    uVar19 = end - 1;
    uVar16 = uVar19 - start;
    if (0x18 < (int)uVar16) {
LAB_0023dd96:
      iVar17 = (uVar16 >> 1) + start;
      pBVar1 = keys + iVar17;
      dVar3 = keys[iVar17].val;
      lVar12 = (long)(int)uVar19;
      lVar11 = (long)start;
      uVar9 = uVar19;
      uVar16 = start;
      do {
        uVar10 = (ulong)uVar9;
        uVar15 = uVar16;
        if ((type & 1U) == 0) {
          if ((int)uVar16 < (int)uVar19) {
            pBVar13 = keys + (int)uVar16;
            lVar14 = 0;
            do {
              dVar4 = pBVar13->val;
              if (((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) && (0.0 < dVar4 - dVar3)) {
                uVar15 = uVar16 - (int)lVar14;
                break;
              }
              lVar14 = lVar14 + -1;
              pBVar13 = pBVar13 + 1;
              uVar15 = uVar19;
            } while (-lVar12 + (long)(int)uVar16 != lVar14);
          }
          if (start < (int)uVar9) {
            uVar10 = (ulong)(int)uVar9;
            pBVar13 = keys + uVar10;
            do {
              if (pBVar13->val <= dVar3) goto LAB_0023de97;
              uVar10 = uVar10 - 1;
              pBVar13 = pBVar13 + -1;
            } while (lVar11 < (long)uVar10);
            goto LAB_0023de95;
          }
        }
        else {
          if ((int)uVar16 < (int)uVar19) {
            pBVar13 = keys + (int)uVar16;
            lVar14 = 0;
            do {
              if (dVar3 < pBVar13->val || dVar3 == pBVar13->val) {
                uVar15 = uVar16 - (int)lVar14;
                break;
              }
              lVar14 = lVar14 + -1;
              pBVar13 = pBVar13 + 1;
              uVar15 = uVar19;
            } while (-lVar12 + (long)(int)uVar16 != lVar14);
          }
          if (start < (int)uVar9) {
            uVar10 = (ulong)(int)uVar9;
            pBVar13 = keys + uVar10;
            do {
              dVar4 = pBVar13->val;
              if (((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) && (dVar4 - dVar3 < 0.0))
              goto LAB_0023de97;
              uVar10 = uVar10 - 1;
              pBVar13 = pBVar13 + -1;
            } while (lVar11 < (long)uVar10);
LAB_0023de95:
            uVar10 = (ulong)(uint)start;
          }
        }
LAB_0023de97:
        uVar9 = (uint)uVar10;
        if ((int)uVar9 <= (int)uVar15) goto LAB_0023ded2;
        pBVar13 = keys + (int)uVar15;
        dVar4 = pBVar13->val;
        iVar7 = pBVar13->idx;
        BVar8 = pBVar13->src;
        pBVar13 = keys + (int)uVar9;
        iVar17 = pBVar13->idx;
        BVar6 = pBVar13->src;
        pBVar2 = keys + (int)uVar15;
        pBVar2->val = pBVar13->val;
        pBVar2->idx = iVar17;
        pBVar2->src = BVar6;
        pBVar13 = keys + (int)uVar9;
        pBVar13->val = dVar4;
        pBVar13->idx = iVar7;
        pBVar13->src = BVar8;
        uVar16 = uVar15 + 1;
        uVar9 = uVar9 - 1;
      } while( true );
    }
LAB_0023e00e:
    if (0 < (int)uVar16) {
      SPxShellsort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                (keys,uVar19,compare,start);
      return;
    }
  }
  return;
LAB_0023ded2:
  if ((type & 1U) == 0) {
    if (start < (int)uVar9) {
      uVar10 = (ulong)(int)uVar9;
      pBVar13 = keys + uVar10;
      do {
        dVar4 = pBVar13->val;
        if (((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) && (0.0 < dVar3 - dVar4))
        goto LAB_0023df59;
        uVar10 = uVar10 - 1;
        pBVar13 = pBVar13 + -1;
      } while (lVar11 < (long)uVar10);
      uVar10 = (ulong)(uint)start;
    }
LAB_0023df59:
    uVar9 = (uint)uVar10;
    if (uVar9 == uVar19) {
      pBVar13 = keys + lVar12;
      dVar3 = pBVar13->val;
      iVar7 = pBVar13->idx;
      BVar8 = pBVar13->src;
      iVar17 = pBVar1->idx;
      BVar6 = pBVar1->src;
      pBVar13 = keys + lVar12;
      pBVar13->val = pBVar1->val;
      pBVar13->idx = iVar17;
      pBVar13->src = BVar6;
      pBVar1->val = dVar3;
      pBVar1->idx = iVar7;
      pBVar1->src = BVar8;
      uVar9 = uVar19 - 1;
    }
  }
  else {
    uVar16 = uVar15;
    if ((int)uVar15 < (int)uVar19) {
      pBVar13 = keys + (int)uVar15;
      lVar14 = 0;
      do {
        dVar4 = pBVar13->val;
        if (((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) && (dVar3 - dVar4 < 0.0)) {
          uVar16 = uVar15 - (int)lVar14;
          break;
        }
        lVar14 = lVar14 + -1;
        pBVar13 = pBVar13 + 1;
        uVar16 = uVar19;
      } while ((int)uVar15 - lVar12 != lVar14);
    }
    uVar15 = uVar16;
    if (uVar15 == start) {
      pBVar13 = keys + lVar11;
      dVar3 = pBVar13->val;
      iVar7 = pBVar13->idx;
      BVar8 = pBVar13->src;
      iVar17 = pBVar1->idx;
      BVar6 = pBVar1->src;
      pBVar13 = keys + lVar11;
      pBVar13->val = pBVar1->val;
      pBVar13->idx = iVar17;
      pBVar13->src = BVar6;
      pBVar1->val = dVar3;
      pBVar1->idx = iVar7;
      pBVar1->src = BVar8;
      uVar15 = start + 1;
    }
  }
  uVar16 = uVar9 - start;
  uVar18 = uVar19 - uVar15;
  if ((int)uVar18 < (int)uVar16) {
    bVar5 = (int)uVar19 <= (int)uVar15;
    uVar20 = uVar9;
    uVar18 = uVar16;
    uVar9 = uVar19;
    uVar19 = uVar15;
    uVar15 = start;
    if (bVar5) goto LAB_0023dff8;
  }
  else {
    bVar5 = (int)uVar9 <= start;
    uVar20 = uVar19;
    uVar16 = uVar18;
    uVar19 = start;
    start = uVar15;
    if (bVar5) goto LAB_0023dff8;
  }
  SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
            (keys,uVar9 + 1,compare,uVar19,(bool)(~type & 1));
  uVar16 = uVar18;
  start = uVar15;
LAB_0023dff8:
  uVar19 = uVar20;
  type = (bool)(type ^ 1);
  if ((int)uVar16 < 0x19) goto LAB_0023e00e;
  goto LAB_0023dd96;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}